

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,Arena *arena)

{
  char *pcVar1;
  ushort uVar2;
  undefined4 uVar3;
  ulong uVar4;
  pointer pcVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  string *psVar9;
  string *psVar10;
  ulong uVar11;
  ulong uVar12;
  string *s;
  uint res;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  byte bVar16;
  pair<const_char_*,_int> pVar17;
  string_view sVar18;
  pair<const_char_*,_unsigned_int> pVar19;
  string_view message_name;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff78;
  MapTypeCard local_81;
  byte *local_80;
  byte local_76;
  byte local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  internal *local_68;
  TcParseTableBase *local_60;
  FieldEntry *local_58;
  NodeBase *local_50;
  ulong local_48;
  
  uVar4 = *(ulong *)&aux->enum_range;
  uVar14 = uVar4 >> 0x10 & 0xffff;
  bVar16 = (byte)uVar4 & 7 | 8;
  local_70 = (uint)bVar16;
  local_75 = (byte)(uVar4 >> 8) & 7 | 0x10;
  local_74 = (uint)local_75;
  local_48 = uVar4 >> 0x20 & 0xffff;
  local_6c = (uint)uVar14;
  local_76 = ((byte)(uVar14 >> 3) & 0x1f | (byte)(uVar14 >> 2) & 0x3f) & 1;
  local_80 = (byte *)ptr;
  local_60 = table;
  local_58 = entry;
  local_50 = node;
  do {
    bVar6 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_80;
    }
    bVar7 = *local_80;
    if ((bVar16 != bVar7) && (local_75 != bVar7)) {
      res = (uint)bVar7;
      pbVar15 = local_80 + 1;
      if ((char)bVar7 < '\0') {
        res = (res + (uint)*pbVar15 * 0x80) - 0x80;
        if ((char)*pbVar15 < '\0') {
          pVar19 = ReadTagFallback((char *)local_80,res);
          pbVar15 = (byte *)pVar19.first;
          res = pVar19.second;
        }
        else {
          pbVar15 = local_80 + 2;
        }
      }
      local_80 = pbVar15;
      if ((res == local_70) || (res == local_74)) goto LAB_0029b033;
      if (pbVar15 != (byte *)0x0) {
        if (res == 0 || (res & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          iVar13 = 3;
        }
        else {
          local_80 = (byte *)UnknownFieldParse(res,(string *)0x0,(char *)pbVar15,ctx);
LAB_0029b148:
          iVar13 = 2 - (uint)(local_80 == (byte *)0x0);
        }
        goto LAB_0029b0fe;
      }
LAB_0029b32c:
      iVar13 = 1;
      goto LAB_0029b0fe;
    }
    res = (uint)(char)bVar7;
    local_80 = local_80 + 1;
LAB_0029b033:
    uVar14 = uVar4 >> 8;
    if (res == local_70) {
      uVar14 = uVar4;
    }
    uVar12 = local_48;
    if (res == local_70) {
      uVar12 = 8;
    }
    local_81.data_ = (uint8_t)uVar14;
    if (5 < (local_81.data_ & 7)) {
switchD_0029b07a_caseD_3:
      ParseOneMapEntry();
LAB_0029b451:
      ParseOneMapEntry();
LAB_0029b456:
      ParseOneMapEntry();
LAB_0029b463:
      ParseOneMapEntry();
    }
    s = (string *)((long)&local_50->next + uVar12);
    switch((uint)uVar14 & 7) {
    case 0:
      uVar14 = (ulong)(char)*local_80;
      if ((long)uVar14 < 0) {
        uVar12 = (long)(char)local_80[1] << 7 | 0x7f;
        if ((long)uVar12 < 0) {
          uVar11 = (long)(char)local_80[2] << 0xe | 0x3fff;
          if ((long)uVar11 < 0) {
            uVar12 = uVar12 & ((long)(char)local_80[3] << 0x15 | 0x1fffffU);
            if ((long)uVar12 < 0) {
              uVar11 = uVar11 & ((long)(char)local_80[4] << 0x1c | 0xfffffffU);
              if ((long)uVar11 < 0) {
                uVar12 = uVar12 & ((long)(char)local_80[5] << 0x23 | 0x7ffffffffU);
                if ((long)uVar12 < 0) {
                  uVar11 = uVar11 & ((long)(char)local_80[6] << 0x2a | 0x3ffffffffffU);
                  if ((long)uVar11 < 0) {
                    uVar12 = uVar12 & ((long)(char)local_80[7] << 0x31 | 0x1ffffffffffffU);
                    if ((long)uVar12 < 0) {
                      uVar11 = uVar11 & ((ulong)local_80[8] << 0x38 | 0xffffffffffffff);
                      if ((long)uVar11 < 0) {
                        pbVar15 = local_80 + 10;
                        if (local_80[9] != 1) {
                          if ((char)local_80[9] < '\0') {
                            pbVar15 = (byte *)0x0;
                            goto LAB_0029b094;
                          }
                          if ((local_80[9] & 1) == 0) {
                            uVar11 = uVar11 ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        pbVar15 = local_80 + 9;
                      }
                    }
                    else {
                      pbVar15 = local_80 + 8;
                    }
                  }
                  else {
                    pbVar15 = local_80 + 7;
                  }
                }
                else {
                  pbVar15 = local_80 + 6;
                }
              }
              else {
                pbVar15 = local_80 + 5;
              }
            }
            else {
              pbVar15 = local_80 + 4;
            }
          }
          else {
            pbVar15 = local_80 + 3;
          }
          uVar12 = uVar12 & uVar11;
        }
        else {
          pbVar15 = local_80 + 2;
        }
        uVar14 = uVar14 & uVar12;
      }
      else {
        pbVar15 = local_80 + 1;
      }
LAB_0029b094:
      local_80 = pbVar15;
      if (pbVar15 == (byte *)0x0) goto LAB_0029b32c;
      bVar7 = local_81.data_ >> 3 & 7;
      if (bVar7 == 0) {
        *(bool *)&(s->_M_dataplus)._M_p = uVar14 != 0;
        break;
      }
      if (bVar7 == 1) {
        ParseOneMapEntry();
        break;
      }
      if (bVar7 == 2) {
        ParseOneMapEntry();
        break;
      }
      goto LAB_0029b451;
    case 1:
      pcVar5 = *(pointer *)local_80;
      local_80 = local_80 + 8;
      (s->_M_dataplus)._M_p = pcVar5;
      break;
    case 2:
      uVar14 = (ulong)(local_81.data_ >> 3) & 0xffffffffffffff07;
      if ((char)uVar14 != '\x03') {
        if ((int)uVar14 == 4) {
          psVar9 = (string *)0x0;
        }
        else {
          psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (uVar14,4,"+type_card.cpp_type() == +MapTypeCard::kMessage");
        }
        if (psVar9 == (string *)0x0) {
          if (res == local_74) {
            psVar10 = (string *)0x0;
          }
          else {
            psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,unsigned_char>
                                ((ulong)res,(uchar)local_74,"inner_tag == value_tag");
          }
          if (psVar10 != (string *)0x0) goto LAB_0029b463;
          local_80 = (byte *)ParseContext::ParseMessage(ctx,(MessageLite *)s,(char *)local_80);
          goto LAB_0029b148;
        }
        goto LAB_0029b456;
      }
      bVar7 = *local_80;
      pVar17.second._0_1_ = bVar7;
      pVar17.first = (char *)uVar14;
      pVar17._9_7_ = 0;
      if ((char)bVar7 < '\0') {
        pVar17 = ReadSizeFallback((char *)local_80,(uint)bVar7);
        local_80 = (byte *)pVar17.first;
      }
      else {
        local_80 = local_80 + 1;
      }
      iVar13 = 1;
      if ((local_80 != (byte *)0x0) &&
         (local_80 = (byte *)EpsCopyInputStream::ReadString
                                       (&ctx->super_EpsCopyInputStream,(char *)local_80,
                                        pVar17.second,s), local_80 != (byte *)0x0)) {
        bVar6 = MapTypeCard::is_utf8(&local_81);
        if ((bVar6) &&
           ((local_76 != 0 &&
            (cVar8 = utf8_range::IsStructurallyValid(s->_M_string_length,(s->_M_dataplus)._M_p),
            cVar8 == '\0')))) {
          pcVar1 = (char *)((long)&local_60->has_bits_offset +
                           (ulong)local_60->num_aux_entries * 8 + (ulong)local_60->aux_offset);
          uVar2 = local_60->num_field_entries;
          local_68 = (internal *)(long)*pcVar1;
          sVar18 = FieldName(local_60,local_58);
          message_name._M_str = (char *)sVar18._M_len;
          message_name._M_len = (size_t)(pcVar1 + (uVar2 + 8 & 0xfffffff8));
          field_name._M_str = "parsing";
          field_name._M_len = (size_t)sVar18._M_str;
          PrintUTF8ErrorLog(local_68,message_name,field_name,(char *)0x0,
                            (bool)in_stack_ffffffffffffff78);
          if ((local_6c & 4) != 0) goto LAB_0029b0fe;
        }
        break;
      }
      goto LAB_0029b0fe;
    default:
      goto switchD_0029b07a_caseD_3;
    case 5:
      uVar3 = *(undefined4 *)local_80;
      local_80 = local_80 + 4;
      *(undefined4 *)&(s->_M_dataplus)._M_p = uVar3;
    }
    iVar13 = 2;
LAB_0029b0fe:
    if (iVar13 != 2) {
      if (iVar13 != 3) {
        local_80 = (byte *)0x0;
      }
      return (char *)local_80;
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, Arena* arena) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = WFL::MakeTag(1, map_info.key_type_card.wiretype());
  const uint8_t value_tag =
      WFL::MakeTag(2, map_info.value_type_card.wiretype());

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                               inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                                 inner_tag != value_tag)) {
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      obj = node->GetVoidValue(map_info.node_size_info);
    }

    switch (type_card.wiretype()) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_card.cpp_type()) {
          case MapTypeCard::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case MapTypeCard::k32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case MapTypeCard::k64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_card.cpp_type() == MapTypeCard::kString) {
          const int size = ReadSize(&ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(+type_card.cpp_type(), +MapTypeCard::kMessage);
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseMessage(reinterpret_cast<MessageLite*>(obj), ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}